

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::WindingCase::iterate(WindingCase *this)

{
  int iVar1;
  TestLog *pTVar2;
  RenderContext *pRVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_01;
  ObjectTraits *traits;
  Surface *surface;
  uint uVar10;
  void *__buf;
  int iVar11;
  Winding WVar12;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ostringstream *poVar18;
  bool bVar19;
  RandomViewport viewport;
  Surface rendered;
  VertexArray vao;
  string local_240;
  RandomViewport local_220;
  Surface local_210;
  string local_1f8;
  long local_1d8;
  RenderContext *local_1d0;
  ObjectWrapper local_1c8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [2];
  long *local_190;
  long local_180 [9];
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_220,(RenderTarget *)CONCAT44(extraout_var,iVar5),0x40,0x40,dVar6);
  dVar6 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar5 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar9 = CONCAT44(extraout_var_00,iVar5);
  local_1d0 = pRVar3;
  iVar5 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1c8,(Functions *)CONCAT44(extraout_var_01,iVar5),traits);
  (**(code **)(lVar9 + 0x1a00))(local_220.x,local_220.y,local_220.width,local_220.height);
  (**(code **)(lVar9 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x1680))(dVar6);
  (**(code **)(lVar9 + 0xfd8))(0x8e72,1);
  (**(code **)(lVar9 + 0x5e0))(0xb44);
  (**(code **)(lVar9 + 0xd8))(local_1c8.m_object);
  poVar18 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar18,"Face culling enabled",0x14)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar18);
  std::ios_base::~ios_base(local_138);
  bVar4 = true;
  WVar12 = WINDING_CCW;
  local_1d8 = lVar9;
  do {
    lVar9 = local_1d8;
    poVar18 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar18,"Setting glFrontFace(",0x14);
    pcVar13 = "GL_CW";
    if (WVar12 == WINDING_CCW) {
      pcVar13 = "GL_CCW";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar18,pcVar13,(ulong)(WVar12 == WINDING_CCW) + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar18,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar18);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar9 + 0x6c0))((WVar12 == WINDING_CCW) + 0x900);
    (**(code **)(lVar9 + 0x188))(0x4000);
    (**(code **)(lVar9 + 0x538))(0xe,0,1);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0xb07);
    getPixels(&local_210,local_1d0,local_220.x,local_220.y,local_220.width,local_220.height);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"RenderedImage","");
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Rendered Image","");
    surface = &local_210;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_240,&local_1f8,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar2,__buf,(size_t)surface);
    if (local_190 != local_180) {
      operator_delete(local_190,local_180[0] + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    iVar17 = local_210.m_height;
    iVar5 = local_210.m_width;
    uVar10 = local_210.m_height;
    if (local_210.m_height < local_210.m_width) {
      uVar10 = local_210.m_width;
    }
    iVar16 = 0;
    iVar7 = uVar10 * 5;
    if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
      iVar7 = 0;
    }
    iVar11 = 0;
    if (0 < local_210.m_height) {
      iVar8 = 0;
      uVar10 = 0;
      iVar11 = 0;
      iVar16 = 0;
      do {
        uVar14 = (ulong)(uint)local_210.m_width;
        iVar15 = iVar8;
        if (0 < local_210.m_width) {
          do {
            iVar1 = *(int *)((long)local_210.m_pixels.m_ptr + (long)iVar15 * 4);
            iVar11 = iVar11 + (uint)(iVar1 == -1);
            iVar16 = iVar16 + (uint)(iVar1 == -0xffff01);
            iVar15 = iVar15 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar10 = uVar10 + 1;
        iVar8 = iVar8 + local_210.m_width;
      } while (uVar10 != local_210.m_height);
    }
    poVar18 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar18,"Note: got ",10);
    std::ostream::operator<<(poVar18,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar18," white and ",0xb);
    std::ostream::operator<<(poVar18,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar18," red pixels",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    iVar17 = iVar17 * iVar5;
    std::__cxx11::ostringstream::~ostringstream(poVar18);
    std::ios_base::~ios_base(local_138);
    iVar5 = iVar17 - (iVar16 + iVar11);
    if (iVar7 < iVar5) {
      poVar18 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar18,"Failure: Got ",0xd);
      std::ostream::operator<<(poVar18,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar18," other than white or red pixels (maximum tolerance ",0x33);
      std::ostream::operator<<(poVar18,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar18,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar18);
      std::ios_base::~ios_base(local_138);
      bVar19 = false;
      bVar4 = false;
    }
    else if (WVar12 == this->m_winding) {
      bVar19 = true;
      if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
        if (iVar11 != iVar17) {
          local_1b0._0_8_ = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),
                     "Failure: expected only white pixels (full-viewport quad)",0x38);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_014308e1;
        }
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        iVar11 = iVar11 - iVar17 / 2;
        iVar5 = -iVar11;
        if (0 < iVar11) {
          iVar5 = iVar11;
        }
        if (iVar7 < iVar5) {
          poVar18 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = pTVar2;
          std::__cxx11::ostringstream::ostringstream(poVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar18,
                     "Failure: wrong number of white pixels; expected approximately ",0x3e);
          std::ostream::operator<<(poVar18,iVar17 / 2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_014308e1;
        }
      }
    }
    else if (iVar11 == 0) {
      bVar19 = true;
    }
    else {
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Failure: expected only red pixels (everything culled)",
                 0x35);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_014308e1:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      bVar19 = false;
      bVar4 = false;
    }
    tcu::Surface::~Surface(&local_210);
    if ((!bVar19) || (bVar19 = WVar12 != WINDING_CCW, WVar12 = WVar12 + WINDING_CW, bVar19)) {
      pcVar13 = "Image verification failed";
      if (bVar4) {
        pcVar13 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar4,
                 pcVar13);
      glu::ObjectWrapper::~ObjectWrapper(&local_1c8);
      return STOP;
    }
  } while( true );
}

Assistant:

WindingCase::IterateResult WindingCase::iterate (void)
{
	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();
	const glu::VertexArray			vao							(renderCtx);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	gl.enable(GL_CULL_FACE);

	gl.bindVertexArray(*vao);

	log << TestLog::Message << "Face culling enabled" << TestLog::EndMessage;

	for (int frontFaceWinding = 0; frontFaceWinding < WINDING_LAST; frontFaceWinding++)
	{
		log << TestLog::Message << "Setting glFrontFace(" << (frontFaceWinding == WINDING_CW ? "GL_CW" : "GL_CCW") << ")" << TestLog::EndMessage;

		gl.frontFace(frontFaceWinding == WINDING_CW ? GL_CW : GL_CCW);

		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

		{
			const tcu::Surface rendered = getPixels(renderCtx, viewport);
			log << TestLog::Image("RenderedImage", "Rendered Image", rendered);

			{
				const int totalNumPixels		= rendered.getWidth()*rendered.getHeight();
				const int badPixelTolerance		= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 5*de::max(rendered.getWidth(), rendered.getHeight()) : 0;

				int numWhitePixels	= 0;
				int numRedPixels	= 0;
				for (int y = 0; y < rendered.getHeight();	y++)
				for (int x = 0; x < rendered.getWidth();	x++)
				{
					numWhitePixels	+= rendered.getPixel(x, y) == tcu::RGBA::white()	? 1 : 0;
					numRedPixels	+= rendered.getPixel(x, y) == tcu::RGBA::red()	? 1 : 0;
				}

				DE_ASSERT(numWhitePixels + numRedPixels <= totalNumPixels);

				log << TestLog::Message << "Note: got " << numWhitePixels << " white and " << numRedPixels << " red pixels" << TestLog::EndMessage;

				if (totalNumPixels - numWhitePixels - numRedPixels > badPixelTolerance)
				{
					log << TestLog::Message << "Failure: Got " << totalNumPixels - numWhitePixels - numRedPixels << " other than white or red pixels (maximum tolerance " << badPixelTolerance << ")" << TestLog::EndMessage;
					success = false;
					break;
				}

				if ((Winding)frontFaceWinding == m_winding)
				{
					if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					{
						if (de::abs(numWhitePixels - totalNumPixels/2) > badPixelTolerance)
						{
							log << TestLog::Message << "Failure: wrong number of white pixels; expected approximately " << totalNumPixels/2 << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
					{
						if (numWhitePixels != totalNumPixels)
						{
							log << TestLog::Message << "Failure: expected only white pixels (full-viewport quad)" << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else
						DE_ASSERT(false);
				}
				else
				{
					if (numWhitePixels != 0)
					{
						log << TestLog::Message << "Failure: expected only red pixels (everything culled)" << TestLog::EndMessage;
						success = false;
						break;
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image verification failed");
	return STOP;
}